

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O2

bool __thiscall
Indexing::ClauseCodeTree::ClauseMatcher::canEnterLiteral(ClauseMatcher *this,CodeOp *op)

{
  Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled> *pRVar1
  ;
  _Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false> _Var2;
  bool bVar3;
  MatchInfo **ppMVar4;
  ulong uVar5;
  size_t ilIndex;
  ulong uVar6;
  ILStruct *this_00;
  ILStruct *targets;
  bool bVar7;
  
  this_00 = (ILStruct *)(op->_content >> 3);
  if ((this_00->timestamp == (this->tree->super_CodeTree)._curTimeStamp) &&
     (this_00->visited != false)) {
    bVar7 = false;
  }
  else {
    pRVar1 = (this->lms)._cursor;
    if ((ulong)((long)pRVar1 - (long)(this->lms)._stack) < 0x11) {
LAB_0026ca9f:
      bVar7 = true;
    }
    else {
      if ((this_00->varCnt != 0) &&
         (_Var2._M_head_impl =
               pRVar1[-1]._self._M_t.
               super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
               ._M_t.
               super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
               .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>.
               _M_head_impl, (_Var2._M_head_impl)->_eagerlyMatched == false)) {
        LiteralMatcher::doEagerMatching(_Var2._M_head_impl);
      }
      uVar6 = 0;
      do {
        pRVar1 = (this->lms)._stack;
        bVar7 = ((long)(this->lms)._cursor - (long)pRVar1 >> 4) - 1U <= uVar6;
        if (bVar7) goto LAB_0026ca9f;
        _Var2._M_head_impl =
             pRVar1[uVar6]._self._M_t.
             super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
             ._M_t.
             super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
             .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>._M_head_impl;
        targets = (ILStruct *)(**(ulong **)&(_Var2._M_head_impl)->super_Matcher >> 3);
        if ((targets->varCnt != 0) && ((_Var2._M_head_impl)->_eagerlyMatched == false)) {
          LiteralMatcher::doEagerMatching(_Var2._M_head_impl);
        }
        uVar5 = (ulong)this_00->matchCnt;
        while (uVar5 != 0) {
          uVar5 = uVar5 - 1;
          ppMVar4 = CodeTree::ILStruct::getMatch(this_00,(uint)uVar5);
          bVar3 = existsCompatibleMatch(this,this_00,*ppMVar4,targets);
          if (!bVar3) {
            CodeTree::ILStruct::deleteMatch(this_00,(uint)uVar5);
          }
        }
        uVar6 = uVar6 + 1;
      } while (this_00->matchCnt != 0);
    }
  }
  return bVar7;
}

Assistant:

inline bool ClauseCodeTree::ClauseMatcher::canEnterLiteral(CodeOp* op)
{
  ASS(op->isLitEnd());
  ASS_EQ(lms.top()->op, op);

  ILStruct* ils=op->getILS();
  if(ils->timestamp==tree->_curTimeStamp && ils->visited) {
    return false;
  }

  if(lms.size()>1) {
    //we have already matched and entered some index literals, so we
    //will check for compatibility of variable assignments
    if(ils->varCnt && !lms.top()->eagerlyMatched()) {
      lms.top()->doEagerMatching();
      RSTAT_MST_INC("match count", lms.size()-1, lms.top()->getILS()->matchCnt);
    }
    for(size_t ilIndex=0;ilIndex<lms.size()-1;ilIndex++) {
      ILStruct* prevILS=lms[ilIndex]->getILS();
      if(prevILS->varCnt && !lms[ilIndex]->eagerlyMatched()) {
	lms[ilIndex]->doEagerMatching();
	RSTAT_MST_INC("match count", ilIndex, lms[ilIndex]->getILS()->matchCnt);
      }

      size_t matchIndex=ils->matchCnt;
      while(matchIndex!=0) {
	matchIndex--;
	MatchInfo* mi=ils->getMatch(matchIndex);
	if(!existsCompatibleMatch(ils, mi, prevILS)) {
	  ils->deleteMatch(matchIndex); //decreases ils->matchCnt
	}
      }
      if(!ils->matchCnt) {
	return false;
      }
    }
  }

  return true;
}